

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O1

int luaB_tonumber(lua_State *L)

{
  char cVar1;
  byte bVar2;
  ushort *puVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  size_t sVar8;
  ushort **ppuVar9;
  byte *pbVar10;
  __int32_t **pp_Var11;
  size_t sVar12;
  byte *__s;
  undefined8 unaff_R13;
  long lVar13;
  size_t l;
  lua_Integer local_58;
  size_t local_50;
  char *local_48;
  lua_State *local_40;
  undefined8 local_38;
  
  iVar4 = lua_type(L,2);
  if (iVar4 < 1) {
    iVar4 = lua_type(L,1);
    if (iVar4 == 3) {
      lua_settop(L,1);
      return 1;
    }
    pcVar7 = lua_tolstring(L,1,&local_50);
    if ((pcVar7 != (char *)0x0) && (sVar12 = lua_stringtonumber(L,pcVar7), sVar12 == local_50 + 1))
    {
      return 1;
    }
    luaL_checkany(L,1);
  }
  else {
    uVar6 = luaL_checkinteger(L,2);
    luaL_checktype(L,1,4);
    pcVar7 = lua_tolstring(L,1,&local_50);
    if (0x22 < uVar6 - 2) {
      luaL_argerror(L,2,"base out of range");
    }
    sVar8 = strspn(pcVar7," \f\n\r\t\v");
    cVar1 = pcVar7[sVar8];
    __s = (byte *)(pcVar7 + ((cVar1 - 0x2bU & 0xfd) == 0) + sVar8);
    ppuVar9 = __ctype_b_loc();
    puVar3 = *ppuVar9;
    local_58 = 0;
    pbVar10 = (byte *)0x0;
    if ((puVar3[*__s] & 8) != 0) {
      local_58 = 0;
      lVar13 = 0;
      local_48 = pcVar7;
      local_40 = L;
      local_38 = CONCAT71((int7)((ulong)unaff_R13 >> 8),cVar1);
      do {
        bVar2 = *__s;
        if ((*(byte *)((long)puVar3 + (ulong)bVar2 * 2 + 1) & 8) == 0) {
          pp_Var11 = __ctype_toupper_loc();
          uVar5 = (*pp_Var11)[bVar2] - 0x37;
        }
        else {
          uVar5 = (int)(char)bVar2 - 0x30;
        }
        if ((uint)uVar6 <= uVar5) {
          pbVar10 = (byte *)0x0;
          L = local_40;
          pcVar7 = local_48;
          goto LAB_0012390c;
        }
        lVar13 = (ulong)uVar5 + lVar13 * (uVar6 & 0xffffffff);
        pbVar10 = __s + 1;
        __s = __s + 1;
      } while ((puVar3[*pbVar10] & 8) != 0);
      sVar8 = strspn((char *)__s," \f\n\r\t\v");
      pbVar10 = __s + sVar8;
      L = local_40;
      pcVar7 = local_48;
      local_58 = -lVar13;
      if ((char)local_38 != '-') {
        local_58 = lVar13;
      }
    }
LAB_0012390c:
    if (pbVar10 == (byte *)(pcVar7 + local_50)) {
      lua_pushinteger(L,local_58);
      return 1;
    }
  }
  lua_pushnil(L);
  return 1;
}

Assistant:

static int luaB_tonumber (lua_State *L) {
  if (lua_isnoneornil(L, 2)) {  /* standard conversion? */
    if (lua_type(L, 1) == LUA_TNUMBER) {  /* already a number? */
      lua_settop(L, 1);  /* yes; return it */
      return 1;
    }
    else {
      size_t l;
      const char *s = lua_tolstring(L, 1, &l);
      if (s != NULL && lua_stringtonumber(L, s) == l + 1)
        return 1;  /* successful conversion to number */
      /* else not a number */
      luaL_checkany(L, 1);  /* (but there must be some parameter) */
    }
  }
  else {
    size_t l;
    const char *s;
    lua_Integer n = 0;  /* to avoid warnings */
    lua_Integer base = luaL_checkinteger(L, 2);
    luaL_checktype(L, 1, LUA_TSTRING);  /* no numbers as strings */
    s = lua_tolstring(L, 1, &l);
    luaL_argcheck(L, 2 <= base && base <= 36, 2, "base out of range");
    if (b_str2int(s, cast_uint(base), &n) == s + l) {
      lua_pushinteger(L, n);
      return 1;
    }  /* else not a number */
  }  /* else not a number */
  luaL_pushfail(L);  /* not a number */
  return 1;
}